

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint32 __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  uint8 uVar1;
  bool bVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  int iVar5;
  uint32 uVar7;
  pair<unsigned_long,_bool> pVar8;
  int iVar6;
  
  puVar4 = this->buffer_;
  iVar6 = (int)this->buffer_end_;
  iVar5 = iVar6 - (int)puVar4;
  if (iVar5 < 10) {
    if (iVar5 < 1) {
      if (iVar6 == (int)puVar4) {
        if (((0 < this->buffer_size_after_limit_) ||
            (this->total_bytes_read_ == this->current_limit_)) &&
           (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)) {
          this->legitimate_message_end_ = true;
          return 0;
        }
      }
    }
    else if (-1 < (char)this->buffer_end_[-1]) goto LAB_002809fc;
    puVar4 = this->buffer_;
    puVar3 = this->buffer_end_;
    if (puVar4 == puVar3) {
      bVar2 = Refresh(this);
      if (!bVar2) {
        if (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_) {
          this->legitimate_message_end_ = true;
        }
        else {
          this->legitimate_message_end_ = this->current_limit_ == this->total_bytes_limit_;
        }
        return 0;
      }
      puVar4 = this->buffer_;
      puVar3 = this->buffer_end_;
    }
    if ((puVar4 < puVar3) && (uVar1 = *puVar4, -1 < (char)uVar1)) {
      this->buffer_ = puVar4 + 1;
      uVar7 = (int)(char)uVar1;
    }
    else {
      pVar8 = ReadVarint64Fallback(this);
      uVar7 = 0;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        uVar7 = (uint32)pVar8.first;
      }
    }
    return uVar7;
  }
LAB_002809fc:
  if (first_byte_or_zero == 0) {
    this->buffer_ = puVar4 + 1;
    return 0;
  }
  uVar7 = ((uint)puVar4[1] * 0x80 + first_byte_or_zero) - 0x80;
  if ((char)puVar4[1] < '\0') {
    uVar7 = (uVar7 + (uint)puVar4[2] * 0x4000) - 0x4000;
    if ((char)puVar4[2] < '\0') {
      uVar7 = (uVar7 + (uint)puVar4[3] * 0x200000) - 0x200000;
      if ((char)puVar4[3] < '\0') {
        uVar7 = uVar7 + (uint)puVar4[4] * 0x10000000 + 0xf0000000;
        if ((char)puVar4[4] < '\0') {
          puVar4 = puVar4 + 6;
          iVar5 = 5;
          while ((char)puVar4[-1] < '\0') {
            puVar4 = puVar4 + 1;
            iVar5 = iVar5 + -1;
            if (iVar5 == 0) {
              return 0;
            }
          }
        }
        else {
          puVar4 = puVar4 + 5;
        }
      }
      else {
        puVar4 = puVar4 + 4;
      }
    }
    else {
      puVar4 = puVar4 + 3;
    }
  }
  else {
    puVar4 = puVar4 + 2;
  }
  this->buffer_ = puVar4;
  return uVar7;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}